

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_strrev(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  undefined8 in_RAX;
  char *pcVar1;
  char *pcVar2;
  int c;
  int nLen;
  undefined8 local_28;
  
  if (0 < nArg) {
    local_28 = in_RAX;
    pcVar1 = jx9_value_to_string(*apArg,(int *)((long)&local_28 + 4));
    if (0 < (long)local_28._4_4_) {
      for (pcVar2 = pcVar1 + (long)local_28._4_4_ + -1; pcVar1 <= pcVar2; pcVar2 = pcVar2 + -1) {
        local_28._4_4_ = (int)((ulong)local_28 >> 0x20);
        local_28 = CONCAT44(local_28._4_4_,(int)*pcVar2);
        jx9_value_string(pCtx->pRet,(char *)&local_28,1);
      }
      return 0;
    }
  }
  jx9MemObjRelease(pCtx->pRet);
  return 0;
}

Assistant:

static int jx9Builtin_strrev(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zIn, *zEnd;
	int nLen, c;
	if( nArg < 1 ){
		/* Missing arguments, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the target string */
	zIn = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Empty string Return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Perform the requested operation */
	zEnd = &zIn[nLen - 1];
	for(;;){
		if( zEnd < zIn ){
			/* No more input to process */
			break;
		}
		/* Append current character */
		c = zEnd[0];
		jx9_result_string(pCtx, (const char *)&c, (int)sizeof(char));
		zEnd--;
	}
	return JX9_OK;
}